

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRangeList.cpp
# Opt level: O1

Error __thiscall
llvm::DWARFDebugRangeList::extract
          (DWARFDebugRangeList *this,DWARFDataExtractor *data,uint64_t *offset_ptr)

{
  size_t *psVar1;
  char cVar2;
  DWARFObject *pDVar3;
  iterator __position;
  int iVar4;
  char *pcVar5;
  uint64_t *in_RCX;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  undefined1 auStack_50 [8];
  RangeListEntry Entry;
  uint64_t prev_offset;
  
  (data->super_DataExtractor).Data.Data = (char *)0xffffffffffffffff;
  *(undefined1 *)&(data->super_DataExtractor).Data.Length = 0;
  pDVar3 = *(DWARFObject **)&(data->super_DataExtractor).IsLittleEndian;
  if (data->Obj != pDVar3) {
    data->Obj = pDVar3;
  }
  pcVar5 = (char *)*in_RCX;
  if (pcVar5 < (char *)offset_ptr[1]) {
    psVar1 = &(data->super_DataExtractor).Data.Length;
    cVar2 = *(char *)((long)offset_ptr + 0x11);
    *(char *)psVar1 = cVar2;
    if ((cVar2 == '\x04') || (cVar2 == '\b')) {
      (data->super_DataExtractor).Data.Data = pcVar5;
      do {
        Entry.EndAddress = 0xffffffffffffffff;
        Entry.SectionIndex = *in_RCX;
        auStack_50 = (undefined1  [8])
                     DWARFDataExtractor::getRelocatedValue
                               ((DWARFDataExtractor *)offset_ptr,
                                (uint)*(byte *)((long)offset_ptr + 0x11),in_RCX,(uint64_t *)0x0,
                                (Error *)0x0);
        Entry.StartAddress =
             DWARFDataExtractor::getRelocatedValue
                       ((DWARFDataExtractor *)offset_ptr,(uint)*(byte *)((long)offset_ptr + 0x11),
                        in_RCX,&Entry.EndAddress,(Error *)0x0);
        if (*in_RCX == (uint)(byte)*psVar1 * 2 + Entry.SectionIndex) {
          if (Entry.StartAddress == 0 && auStack_50 == (undefined1  [8])0x0) {
            iVar4 = 3;
          }
          else {
            __position._M_current = (RangeListEntry *)data->Obj;
            if (__position._M_current == (RangeListEntry *)data->Section) {
              std::
              vector<llvm::DWARFDebugRangeList::RangeListEntry,std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>>
              ::_M_realloc_insert<llvm::DWARFDebugRangeList::RangeListEntry_const&>
                        ((vector<llvm::DWARFDebugRangeList::RangeListEntry,std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>>
                          *)&(data->super_DataExtractor).IsLittleEndian,__position,
                         (RangeListEntry *)auStack_50);
            }
            else {
              (__position._M_current)->SectionIndex = Entry.EndAddress;
              (__position._M_current)->StartAddress = (uint64_t)auStack_50;
              (__position._M_current)->EndAddress = Entry.StartAddress;
              data->Obj = data->Obj + 1;
            }
            iVar4 = 0;
          }
        }
        else {
          (data->super_DataExtractor).Data.Data = (char *)0xffffffffffffffff;
          *(undefined1 *)&(data->super_DataExtractor).Data.Length = 0;
          pDVar3 = *(DWARFObject **)&(data->super_DataExtractor).IsLittleEndian;
          if (data->Obj != pDVar3) {
            data->Obj = pDVar3;
          }
          pcVar5 = (char *)std::_V2::generic_category();
          EC._M_cat = (error_category *)0x16;
          EC._0_8_ = this;
          createStringError<unsigned_long>
                    (EC,pcVar5,(unsigned_long *)"invalid range list entry at offset 0x%lx");
          iVar4 = 1;
        }
      } while (iVar4 == 0);
      if (iVar4 != 1) {
        this->Offset = 1;
      }
    }
    else {
      pcVar5 = (char *)std::_V2::generic_category();
      EC_01._M_cat = (error_category *)0x16;
      EC_01._0_8_ = this;
      createStringError<unsigned_char>(EC_01,pcVar5,(uchar *)"invalid address size: %u");
    }
  }
  else {
    pcVar5 = (char *)std::_V2::generic_category();
    EC_00._M_cat = (error_category *)0x16;
    EC_00._0_8_ = this;
    createStringError<unsigned_long>
              (EC_00,pcVar5,(unsigned_long *)"invalid range list offset 0x%lx");
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFDebugRangeList::extract(const DWARFDataExtractor &data,
                                   uint64_t *offset_ptr) {
  clear();
  if (!data.isValidOffset(*offset_ptr))
    return createStringError(errc::invalid_argument,
                       "invalid range list offset 0x%" PRIx64, *offset_ptr);

  AddressSize = data.getAddressSize();
  if (AddressSize != 4 && AddressSize != 8)
    return createStringError(errc::invalid_argument,
                       "invalid address size: %" PRIu8, AddressSize);
  Offset = *offset_ptr;
  while (true) {
    RangeListEntry Entry;
    Entry.SectionIndex = -1ULL;

    uint64_t prev_offset = *offset_ptr;
    Entry.StartAddress = data.getRelocatedAddress(offset_ptr);
    Entry.EndAddress =
        data.getRelocatedAddress(offset_ptr, &Entry.SectionIndex);

    // Check that both values were extracted correctly.
    if (*offset_ptr != prev_offset + 2 * AddressSize) {
      clear();
      return createStringError(errc::invalid_argument,
                         "invalid range list entry at offset 0x%" PRIx64,
                         prev_offset);
    }
    if (Entry.isEndOfListEntry())
      break;
    Entries.push_back(Entry);
  }
  return Error::success();
}